

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O1

void test_read_format_zip_bzip2_multi(void)

{
  int iVar1;
  wchar_t wVar2;
  uint uVar3;
  archive_conflict *a;
  char *pcVar4;
  archive_entry *ae;
  archive_entry *local_38;
  
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'ʝ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_bzip2((archive *)a);
  if (iVar1 != 0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'ʟ');
    test_skipping("bzip2 is not fully supported on this platform");
    archive_read_close((archive *)a);
    return;
  }
  extract_reference_file("test_read_format_zip_bzip2_multi.zipx");
  wVar2 = archive_read_support_format_zip((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ʥ',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",a);
  wVar2 = archive_read_open_filename(a,"test_read_format_zip_bzip2_multi.zipx",0x25);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ʦ',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, refname, 37)"
                      ,a);
  iVar1 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ʨ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_format_name((archive *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ʩ',"ZIP 4.6 (bzip)","\"ZIP 4.6 (bzip)\"",pcVar4,"archive_format_name(a)",
             (void *)0x0,L'\0');
  pcVar4 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ʪ',"smartd.conf","\"smartd.conf\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  uVar3 = extract_one((archive *)a,local_38,0x8dd7379e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ʫ',0,"0",(ulong)uVar3,"extract_one(a, ae, 0x8DD7379E)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ʭ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_format_name((archive *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ʮ',"ZIP 4.6 (bzip)","\"ZIP 4.6 (bzip)\"",pcVar4,"archive_format_name(a)",
             (void *)0x0,L'\0');
  pcVar4 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ʯ',"ts.conf","\"ts.conf\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  uVar3 = extract_one((archive *)a,local_38,0x7ae59b31);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ʰ',0,"0",(ulong)uVar3,"extract_one(a, ae, 0x7AE59B31)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ʲ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_format_name((archive *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ʳ',"ZIP 4.6 (bzip)","\"ZIP 4.6 (bzip)\"",pcVar4,"archive_format_name(a)",
             (void *)0x0,L'\0');
  pcVar4 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ʴ',"vimrc","\"vimrc\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  uVar3 = extract_one((archive *)a,local_38,0xba8e3baa);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ʵ',0,"0",(ulong)uVar3,"extract_one(a, ae, 0xBA8E3BAA)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ʷ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ʸ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ʹ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",a);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_bzip2_multi)
{
	const char *refname = "test_read_format_zip_bzip2_multi.zipx";
	struct archive *a;
	struct archive_entry *ae;

	assert((a = archive_read_new()) != NULL);
	if (ARCHIVE_OK != archive_read_support_filter_bzip2(a)) {
		skipping("bzip2 is not fully supported on this platform");
		archive_read_close(a);
		return;
	}
	extract_reference_file(refname);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname, 37));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 4.6 (bzip)", archive_format_name(a));
	assertEqualString("smartd.conf", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one(a, ae, 0x8DD7379E));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 4.6 (bzip)", archive_format_name(a));
	assertEqualString("ts.conf", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one(a, ae, 0x7AE59B31));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 4.6 (bzip)", archive_format_name(a));
	assertEqualString("vimrc", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one(a, ae, 0xBA8E3BAA));

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}